

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<NULLC::Range,_false,_false>::reset(FastVector<NULLC::Range,_false,_false> *this)

{
  FastVector<NULLC::Range,_false,_false> *this_local;
  
  if (this->data != (Range *)0x0) {
    NULLC::destruct<NULLC::Range>(this->data,(ulong)this->max);
  }
  this->data = (Range *)0x0;
  this->max = 0;
  this->count = 0;
  return;
}

Assistant:

void reset()
	{
		if(data)
		{
			if(!skipConstructor)
				NULLC::destruct(data, max);
			else
				NULLC::alignedDealloc(data);
		}

		data = 0;
		max = 0;
		count = 0;
	}